

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O1

void hwnet::ThreadPool::threadFuncSwap(TaskQueue *queue_)

{
  bool bVar1;
  undefined1 auStack_68 [8];
  taskque local_tasks;
  
  local_tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  local_tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  local_tasks.
  super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                     *)auStack_68,0);
  while( true ) {
    bVar1 = TaskQueue::Get(queue_,(taskque *)auStack_68);
    if (!bVar1) break;
    while (local_tasks.
           super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node !=
           (_Map_pointer)
           local_tasks.
           super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size) {
      (**(code **)**(undefined8 **)
                    local_tasks.
                    super__Deque_base<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                    ._M_impl.super__Deque_impl_data._M_map_size)();
      std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
      pop_front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                 *)auStack_68);
    }
  }
  std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::~deque
            ((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_> *)
             auStack_68);
  return;
}

Assistant:

void ThreadPool::threadFuncSwap(ThreadPool::TaskQueue *queue_) {
	ThreadPool::TaskQueue::taskque local_tasks;
	for(;;) {
		if(!queue_->Get(local_tasks)) {
			return;
		}
		while(!local_tasks.empty()) {
			const Task::Ptr &task = local_tasks.front();
			task->Do();
			local_tasks.pop_front();
		}
	}
}